

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char c)

{
  int iVar1;
  sc_string_rep *r_00;
  char in_DL;
  long *in_RSI;
  sc_string_rep *in_RDI;
  sc_string_rep *r;
  int len;
  int in_stack_ffffffffffffffac;
  sc_string_rep *this_00;
  
  this_00 = in_RDI;
  iVar1 = length((sc_string_old *)0x2f1d30);
  r_00 = (sc_string_rep *)operator_new(0x10);
  sc_string_rep::sc_string_rep(this_00,in_stack_ffffffffffffffac);
  strcpy(r_00->str,*(char **)(*in_RSI + 8));
  r_00->str[iVar1] = in_DL;
  r_00->str[iVar1 + 1] = '\0';
  sc_string_old((sc_string_old *)this_00,r_00);
  return (sc_string_old)in_RDI;
}

Assistant:

sc_string_old sc_string_old::operator+(char c) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + 2 );
    strcpy( r->str, rep->str );
    r->str[len] = c;
    r->str[len+1] = 00;
    return sc_string_old(r);
}